

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

string * adios2sys::SystemTools::FindProgram
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *names,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *path,bool noSystemPath)

{
  string *psVar1;
  pointer pcVar2;
  string *name;
  bool bVar3;
  
  name = (names->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = name == psVar1;
  if (!bVar3) {
    FindProgram(__return_storage_ptr__,name,path,noSystemPath);
    if (__return_storage_ptr__->_M_string_length == 0) {
      do {
        name = name + 1;
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &__return_storage_ptr__->field_2) {
          operator_delete(pcVar2);
        }
        bVar3 = name == psVar1;
        if (bVar3) goto LAB_00730bb2;
        FindProgram(__return_storage_ptr__,name,path,noSystemPath);
      } while (__return_storage_ptr__->_M_string_length == 0);
    }
    if (!bVar3) {
      return __return_storage_ptr__;
    }
  }
LAB_00730bb2:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::FindProgram(const std::vector<std::string>& names,
                                     const std::vector<std::string>& path,
                                     bool noSystemPath)
{
  for (std::string const& name : names) {
    // Try to find the program.
    std::string result = SystemTools::FindProgram(name, path, noSystemPath);
    if (!result.empty()) {
      return result;
    }
  }
  return "";
}